

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

void __thiscall
duckdb::BaseNumericStatsUnifier<duckdb::timestamp_ns_t>::BaseNumericStatsUnifier
          (BaseNumericStatsUnifier<duckdb::timestamp_ns_t> *this)

{
  ColumnStatsUnifier *in_RDI;
  
  ColumnStatsUnifier::ColumnStatsUnifier(in_RDI);
  in_RDI->_vptr_ColumnStatsUnifier = (_func_int **)&PTR__BaseNumericStatsUnifier_0353f390;
  return;
}

Assistant:

void UnifyMinMax(const string &new_min, const string &new_max) override {
		if (new_min.size() != sizeof(T) || new_max.size() != sizeof(T)) {
			throw InternalException("Incorrect size for stats in UnifyMinMax");
		}
		if (!min_is_set) {
			global_min = new_min;
			min_is_set = true;
		} else {
			auto min_val = Load<T>(const_data_ptr_cast(new_min.data()));
			auto global_min_val = Load<T>(const_data_ptr_cast(global_min.data()));
			if (LessThan::Operation(min_val, global_min_val)) {
				global_min = new_min;
			}
		}
		if (!max_is_set) {
			global_max = new_max;
			max_is_set = true;
		} else {
			auto max_val = Load<T>(const_data_ptr_cast(new_max.data()));
			auto global_max_val = Load<T>(const_data_ptr_cast(global_max.data()));
			if (GreaterThan::Operation(max_val, global_max_val)) {
				global_max = new_max;
			}
		}
	}